

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O0

DdNode * Cudd_addTriangle(DdManager *dd,DdNode *f,DdNode *g,DdNode **z,int nz)

{
  int iVar1;
  int *vars_00;
  DdNode *cube_00;
  DdNode *cube;
  DdNode *res;
  int *vars;
  int local_38;
  int nvars;
  int i;
  int nz_local;
  DdNode **z_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  iVar1 = dd->size;
  vars_00 = (int *)malloc((long)iVar1 << 2);
  if (vars_00 == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    dd_local = (DdManager *)0x0;
  }
  else {
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      vars_00[local_38] = -1;
    }
    for (local_38 = 0; local_38 < nz; local_38 = local_38 + 1) {
      vars_00[z[local_38]->index] = local_38;
    }
    cube_00 = Cudd_addComputeCube(dd,z,(int *)0x0,nz);
    if (cube_00 == (DdNode *)0x0) {
      if (vars_00 != (int *)0x0) {
        free(vars_00);
      }
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)cube_00 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)cube_00 & 0xfffffffffffffffe) + 4) + 1;
      do {
        dd->reordered = 0;
        dd_local = (DdManager *)addTriangleRecur(dd,f,g,vars_00,cube_00);
      } while (dd->reordered == 1);
      if (dd_local != (DdManager *)0x0) {
        *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
      }
      Cudd_RecursiveDeref(dd,cube_00);
      if (dd_local != (DdManager *)0x0) {
        *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
      }
      if (vars_00 != (int *)0x0) {
        free(vars_00);
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addTriangle(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode ** z,
  int  nz)
{
    int    i, nvars, *vars;
    DdNode *res, *cube;

    nvars = dd->size;
    vars = ABC_ALLOC(int, nvars);
    if (vars == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < nvars; i++) vars[i] = -1;
    for (i = 0; i < nz; i++) vars[z[i]->index] = i;
    cube = Cudd_addComputeCube(dd, z, NULL, nz);
    if (cube == NULL) {
        ABC_FREE(vars);
        return(NULL);
    }
    cuddRef(cube);

    do {
        dd->reordered = 0;
        res = addTriangleRecur(dd, f, g, vars, cube);
    } while (dd->reordered == 1);
    if (res != NULL) cuddRef(res);
    Cudd_RecursiveDeref(dd,cube);
    if (res != NULL) cuddDeref(res);
    ABC_FREE(vars);
    return(res);

}